

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_number.cpp
# Opt level: O0

EncodeNumberStatus
spvtools::utils::ParseAndEncodeFloatingPointNumber
          (char *text,NumberType *type,function<void_(unsigned_int)> *emit,string *error_msg)

{
  bool bVar1;
  uint16_t uVar2;
  uint __args;
  ErrorMsgStream *pEVar3;
  ErrorMsgStream local_d8;
  uint local_c8;
  uint local_c4;
  uint32_t high;
  uint32_t low;
  unsigned_long local_b8;
  uint64_t decoded_val;
  FloatProxy<double> local_a0;
  HexFloat<spvtools::utils::FloatProxy<double>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>_>_>
  local_98;
  HexFloat<spvtools::utils::FloatProxy<double>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>_>_>
  dVal;
  ErrorMsgStream local_88;
  FloatProxy<float> local_74;
  HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
  local_70;
  uint_type local_6c;
  FloatProxy<spvtools::utils::Float16> local_6a;
  HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
  fVal;
  FloatProxy<spvtools::utils::Float16> local_58;
  HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>_>_>
  local_56;
  int local_54;
  undefined1 local_50 [2];
  HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>_>_>
  hVal;
  int bit_width;
  ErrorMsgStream local_40;
  string *local_30;
  string *error_msg_local;
  function<void_(unsigned_int)> *emit_local;
  NumberType *type_local;
  char *text_local;
  
  local_30 = error_msg;
  error_msg_local = (string *)emit;
  emit_local = (function<void_(unsigned_int)> *)type;
  type_local = (NumberType *)text;
  if (text == (char *)0x0) {
    anon_unknown_11::ErrorMsgStream::ErrorMsgStream(&local_40,error_msg);
    (anonymous_namespace)::ErrorMsgStream::operator<<
              ((ErrorMsgStream *)&local_40,"The given text is a nullptr");
    anon_unknown_11::ErrorMsgStream::~ErrorMsgStream(&local_40);
    text_local._4_4_ = kInvalidText;
  }
  else {
    bVar1 = IsFloating(type);
    if (bVar1) {
      local_54 = AssumedBitWidth((NumberType *)emit_local);
      if (local_54 == 0x10) {
        FloatProxy<spvtools::utils::Float16>::FloatProxy(&local_58,0);
        HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>_>_>
        ::HexFloat(&local_56,local_58);
        bVar1 = ParseNumber<spvtools::utils::HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>>>>
                          ((char *)type_local,&local_56);
        if (bVar1) {
          local_6c = (uint_type)
                     HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>_>_>
                     ::value(&local_56);
          FloatProxy<spvtools::utils::Float16>::getAsFloat(&local_6a);
          uVar2 = Float16::get_value((Float16 *)&local_6a);
          std::function<void_(unsigned_int)>::operator()(emit,(uint)uVar2);
          text_local._4_4_ = kSuccess;
        }
        else {
          anon_unknown_11::ErrorMsgStream::ErrorMsgStream((ErrorMsgStream *)&fVal,local_30);
          pEVar3 = (anonymous_namespace)::ErrorMsgStream::operator<<
                             ((ErrorMsgStream *)&fVal,"Invalid 16-bit float literal: ");
          (anonymous_namespace)::ErrorMsgStream::operator<<
                    ((ErrorMsgStream *)pEVar3,(char *)type_local);
          anon_unknown_11::ErrorMsgStream::~ErrorMsgStream((ErrorMsgStream *)&fVal);
          text_local._4_4_ = kInvalidText;
        }
      }
      else if (local_54 == 0x20) {
        FloatProxy<float>::FloatProxy(&local_74,0.0);
        HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
        ::HexFloat(&local_70,local_74);
        bVar1 = ParseNumber<spvtools::utils::HexFloat<spvtools::utils::FloatProxy<float>,spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>>>>
                          ((char *)type_local,&local_70);
        if (bVar1) {
          dVal.value_.data_._4_4_ = local_70.value_.data_;
          __args = BitwiseCast<unsigned_int,spvtools::utils::HexFloat<spvtools::utils::FloatProxy<float>,spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>>>>
                             (local_70);
          std::function<void_(unsigned_int)>::operator()(emit,__args);
          text_local._4_4_ = kSuccess;
        }
        else {
          anon_unknown_11::ErrorMsgStream::ErrorMsgStream(&local_88,local_30);
          pEVar3 = (anonymous_namespace)::ErrorMsgStream::operator<<
                             ((ErrorMsgStream *)&local_88,"Invalid 32-bit float literal: ");
          (anonymous_namespace)::ErrorMsgStream::operator<<
                    ((ErrorMsgStream *)pEVar3,(char *)type_local);
          anon_unknown_11::ErrorMsgStream::~ErrorMsgStream(&local_88);
          text_local._4_4_ = kInvalidText;
        }
      }
      else if (local_54 == 0x40) {
        FloatProxy<double>::FloatProxy(&local_a0,0.0);
        HexFloat<spvtools::utils::FloatProxy<double>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>_>_>
        ::HexFloat(&local_98,local_a0);
        bVar1 = ParseNumber<spvtools::utils::HexFloat<spvtools::utils::FloatProxy<double>,spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>>>>
                          ((char *)type_local,&local_98);
        if (bVar1) {
          _high = local_98.value_.data_;
          local_b8 = BitwiseCast<unsigned_long,spvtools::utils::HexFloat<spvtools::utils::FloatProxy<double>,spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>>>>
                               (local_98);
          local_c4 = (uint)local_b8;
          local_c8 = (uint)(local_b8 >> 0x20);
          std::function<void_(unsigned_int)>::operator()(emit,local_c4);
          std::function<void_(unsigned_int)>::operator()(emit,local_c8);
          text_local._4_4_ = kSuccess;
        }
        else {
          anon_unknown_11::ErrorMsgStream::ErrorMsgStream((ErrorMsgStream *)&decoded_val,local_30);
          pEVar3 = (anonymous_namespace)::ErrorMsgStream::operator<<
                             ((ErrorMsgStream *)&decoded_val,"Invalid 64-bit float literal: ");
          (anonymous_namespace)::ErrorMsgStream::operator<<
                    ((ErrorMsgStream *)pEVar3,(char *)type_local);
          anon_unknown_11::ErrorMsgStream::~ErrorMsgStream((ErrorMsgStream *)&decoded_val);
          text_local._4_4_ = kInvalidText;
        }
      }
      else {
        anon_unknown_11::ErrorMsgStream::ErrorMsgStream(&local_d8,local_30);
        pEVar3 = (anonymous_namespace)::ErrorMsgStream::operator<<
                           ((ErrorMsgStream *)&local_d8,"Unsupported ");
        pEVar3 = (anonymous_namespace)::ErrorMsgStream::operator<<
                           ((ErrorMsgStream *)pEVar3,local_54);
        (anonymous_namespace)::ErrorMsgStream::operator<<
                  ((ErrorMsgStream *)pEVar3,"-bit float literals");
        anon_unknown_11::ErrorMsgStream::~ErrorMsgStream(&local_d8);
        text_local._4_4_ = kUnsupported;
      }
    }
    else {
      anon_unknown_11::ErrorMsgStream::ErrorMsgStream((ErrorMsgStream *)local_50,local_30);
      (anonymous_namespace)::ErrorMsgStream::operator<<
                ((ErrorMsgStream *)local_50,"The expected type is not a float type");
      anon_unknown_11::ErrorMsgStream::~ErrorMsgStream((ErrorMsgStream *)local_50);
      text_local._4_4_ = kInvalidUsage;
    }
  }
  return text_local._4_4_;
}

Assistant:

EncodeNumberStatus ParseAndEncodeFloatingPointNumber(
    const char* text, const NumberType& type,
    std::function<void(uint32_t)> emit, std::string* error_msg) {
  if (!text) {
    ErrorMsgStream(error_msg) << "The given text is a nullptr";
    return EncodeNumberStatus::kInvalidText;
  }

  if (!IsFloating(type)) {
    ErrorMsgStream(error_msg) << "The expected type is not a float type";
    return EncodeNumberStatus::kInvalidUsage;
  }

  const auto bit_width = AssumedBitWidth(type);
  switch (bit_width) {
    case 16: {
      HexFloat<FloatProxy<Float16>> hVal(0);
      if (!ParseNumber(text, &hVal)) {
        ErrorMsgStream(error_msg) << "Invalid 16-bit float literal: " << text;
        return EncodeNumberStatus::kInvalidText;
      }
      // getAsFloat will return the Float16 value, and get_value
      // will return a uint16_t representing the bits of the float.
      // The encoding is therefore correct from the perspective of the SPIR-V
      // spec since the top 16 bits will be 0.
      emit(static_cast<uint32_t>(hVal.value().getAsFloat().get_value()));
      return EncodeNumberStatus::kSuccess;
    } break;
    case 32: {
      HexFloat<FloatProxy<float>> fVal(0.0f);
      if (!ParseNumber(text, &fVal)) {
        ErrorMsgStream(error_msg) << "Invalid 32-bit float literal: " << text;
        return EncodeNumberStatus::kInvalidText;
      }
      emit(BitwiseCast<uint32_t>(fVal));
      return EncodeNumberStatus::kSuccess;
    } break;
    case 64: {
      HexFloat<FloatProxy<double>> dVal(0.0);
      if (!ParseNumber(text, &dVal)) {
        ErrorMsgStream(error_msg) << "Invalid 64-bit float literal: " << text;
        return EncodeNumberStatus::kInvalidText;
      }
      uint64_t decoded_val = BitwiseCast<uint64_t>(dVal);
      uint32_t low = uint32_t(0x00000000ffffffff & decoded_val);
      uint32_t high = uint32_t((0xffffffff00000000 & decoded_val) >> 32);
      emit(low);
      emit(high);
      return EncodeNumberStatus::kSuccess;
    } break;
    default:
      break;
  }
  ErrorMsgStream(error_msg)
      << "Unsupported " << bit_width << "-bit float literals";
  return EncodeNumberStatus::kUnsupported;
}